

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_b64b0::generateRandomFile
               (string *filename,int channelCount,Compression compression,bool bulkWrite,
               Box2i *dataWindow,Box2i *displayWindow)

{
  PixelType PVar1;
  Box *pBVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  char *pcVar6;
  uint *puVar7;
  reference pvVar8;
  Array2D<void_*> *pAVar9;
  void **ppvVar10;
  void *pvVar11;
  byte in_CL;
  Compression in_EDX;
  int in_ESI;
  Box *in_R8;
  Box *in_R9;
  int k_2;
  int j_2;
  int i_5;
  uint l_1;
  int k_1;
  int samples_1;
  int j_1;
  int i_4;
  uint l;
  int k;
  int samples;
  int j;
  int i_3;
  bool bigFile;
  int maxSamples;
  int pointerSize;
  int sampleSize;
  string str_1;
  stringstream ss_1;
  PixelType type_1;
  int i_2;
  DeepFrameBuffer frameBuffer;
  DeepScanLineOutputFile file;
  int i_1;
  Array<Imf_3_2::Array2D<void_*>_> data;
  string str;
  stringstream ss;
  int type;
  int i;
  int height;
  int width;
  float in_stack_fffffffffffff7fc;
  undefined4 uVar12;
  int in_stack_fffffffffffff804;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  undefined4 in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff814;
  long in_stack_fffffffffffff818;
  DeepFrameBuffer *in_stack_fffffffffffff820;
  long in_stack_fffffffffffff858;
  Array<Imf_3_2::Array2D<void_*>_> *in_stack_fffffffffffff860;
  bool local_5c1;
  int local_554;
  int local_550;
  int local_54c;
  uint local_548;
  int local_544;
  uint local_540;
  int local_53c;
  int local_538;
  uint local_534;
  int local_530;
  uint local_52c;
  int local_528;
  int local_524;
  DeepSlice local_518 [56];
  int local_4e0;
  int local_4dc;
  DeepSlice local_4d8 [32];
  stringstream local_4b8 [16];
  undefined1 local_4a8 [376];
  PixelType local_330;
  int local_32c;
  Slice local_328 [56];
  Slice local_2f0 [104];
  undefined1 local_288 [40];
  Channel local_260 [16];
  Channel local_250 [16];
  Channel local_240 [16];
  Channel local_230 [32];
  stringstream local_210 [16];
  undefined1 local_200 [380];
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  Vec2<float> local_68;
  Header local_60 [56];
  Box *local_28;
  Box *local_20;
  byte local_11;
  Compression local_10;
  int local_c;
  
  local_11 = in_CL & 1;
  local_28 = in_R9;
  local_20 = in_R8;
  local_10 = in_EDX;
  local_c = in_ESI;
  poVar4 = std::operator<<((ostream *)&std::cout,"generating ");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  pBVar2 = local_20;
  Imath_3_2::Vec2<float>::Vec2(&local_68,0.0,0.0);
  Imf_3_2::Header::Header(local_60,local_28,pBVar2,1.0,(Vec2 *)&local_68,1.0,INCREASING_Y,local_10);
  Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,local_60);
  Imf_3_2::Header::~Header(local_60);
  poVar4 = std::operator<<((ostream *)&std::cout,"compression ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  local_78 = (*(int *)(local_20 + 8) - *(int *)local_20) + 1;
  local_7c = (*(int *)(local_20 + 0xc) - *(int *)(local_20 + 4)) + 1;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x17f4ae);
  for (local_80 = 0; local_80 < local_c; local_80 = local_80 + 1) {
    local_84 = random_int(in_stack_fffffffffffff804);
    std::__cxx11::stringstream::stringstream(local_210);
    std::ostream::operator<<(local_200,local_80);
    std::__cxx11::stringstream::str();
    if (local_84 == 0) {
      psVar5 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_240,UINT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar5,local_230);
    }
    if (local_84 == 1) {
      psVar5 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_250,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(psVar5,local_230);
    }
    if (local_84 == 2) {
      psVar5 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_260,FLOAT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar5,local_230);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808)
              );
    std::__cxx11::string::~string((string *)local_230);
    std::__cxx11::stringstream::~stringstream(local_210);
  }
  Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  for (local_288._20_4_ = 0; (int)local_288._20_4_ < local_c;
      local_288._20_4_ = local_288._20_4_ + 1) {
    Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
    Imf_3_2::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)in_stack_fffffffffffff820,in_stack_fffffffffffff818,
               CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
  }
  Imf_3_2::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)in_stack_fffffffffffff820,in_stack_fffffffffffff818,
             CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
  pcVar6 = (char *)std::__cxx11::string::c_str();
  remove(pcVar6);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
            ((DeepScanLineOutputFile *)local_288,pcVar6,(Header *)(anonymous_namespace)::header,8);
  Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffff820);
  puVar7 = Imf_3_2::Array2D<unsigned_int>::operator[]
                     ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,0);
  uVar12 = 0;
  Imf_3_2::Slice::Slice
            (local_328,UINT,
             (char *)(puVar7 + (-(long)*(int *)local_20 - (long)(*(int *)(local_20 + 4) * local_78))
                     ),4,(long)local_78 << 2,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_2f0);
  for (local_32c = 0; local_32c < local_c; local_32c = local_32c + 1) {
    local_330 = NUM_PIXELTYPES;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_32c);
    if (*pvVar8 == 0) {
      local_330 = UINT;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_32c);
    if (*pvVar8 == 1) {
      local_330 = HALF;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_32c);
    if (*pvVar8 == 2) {
      local_330 = FLOAT;
    }
    std::__cxx11::stringstream::stringstream(local_4b8);
    std::ostream::operator<<(local_4a8,local_32c);
    std::__cxx11::stringstream::str();
    local_4dc = 0;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_32c);
    if (*pvVar8 == 0) {
      local_4dc = 4;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_32c);
    if (*pvVar8 == 1) {
      local_4dc = 2;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                        (long)local_32c);
    PVar1 = local_330;
    if (*pvVar8 == 2) {
      local_4dc = 4;
    }
    local_4e0 = 8;
    pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
    ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_32c,0);
    uVar12 = 1;
    Imf_3_2::DeepSlice::DeepSlice
              (local_518,PVar1,
               (char *)(ppvVar10 +
                       (-(long)*(int *)local_20 - (long)(*(int *)(local_20 + 4) * local_78))),
               (long)local_4e0,(long)(local_4e0 * local_78),(long)local_4dc,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insert((string *)local_2f0,local_4d8);
    std::__cxx11::string::~string((string *)local_4d8);
    std::__cxx11::stringstream::~stringstream(local_4b8);
  }
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)local_288);
  local_5c1 = 1000 < local_78 || 1000 < local_7c;
  poVar4 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  if ((local_11 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"per-line ");
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    for (local_538 = 0; local_538 < local_7c; local_538 = local_538 + 1) {
      for (local_53c = 0; local_53c < local_78; local_53c = local_53c + 1) {
        local_540 = random_int(in_stack_fffffffffffff804);
        if ((local_5c1) && ((local_538 % 0x3f != 0 || (local_53c % 0x3f != 0)))) {
          local_540 = 0;
        }
        puVar7 = Imf_3_2::Array2D<unsigned_int>::operator[]
                           ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                            (long)local_538);
        puVar7[local_53c] = local_540;
        for (local_544 = 0; local_544 < local_c; local_544 = local_544 + 1) {
          if ((int)local_540 < 1) {
            pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
            ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_544,(long)local_538);
            ppvVar10[local_53c] = (void *)0x0;
          }
          else {
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_544);
            if (*pvVar8 == 0) {
              puVar7 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                 ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                  (long)local_538);
              pvVar11 = operator_new__((ulong)puVar7[local_53c] << 2);
              pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
              ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_544,(long)local_538);
              ppvVar10[local_53c] = pvVar11;
            }
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_544);
            if (*pvVar8 == 1) {
              puVar7 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                 ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                  (long)local_538);
              pvVar11 = operator_new__((ulong)puVar7[local_53c] * 2);
              pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
              ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_544,(long)local_538);
              ppvVar10[local_53c] = pvVar11;
            }
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_544);
            if (*pvVar8 == 2) {
              puVar7 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                 ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                  (long)local_538);
              pvVar11 = operator_new__((ulong)puVar7[local_53c] << 2);
              pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
              ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_544,(long)local_538);
              ppvVar10[local_53c] = pvVar11;
            }
            for (local_548 = 0;
                puVar7 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                   ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                    (long)local_538), local_548 < puVar7[local_53c];
                local_548 = local_548 + 1) {
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  (anonymous_namespace)::channelTypes,(long)local_544);
              if (*pvVar8 == 0) {
                iVar3 = local_538 * local_78;
                pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
                ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_544,(long)local_538);
                *(int *)((long)ppvVar10[local_53c] + (ulong)local_548 * 4) =
                     (iVar3 + local_53c) % 0x801;
              }
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  (anonymous_namespace)::channelTypes,(long)local_544);
              if (*pvVar8 == 1) {
                pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
                Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_544,(long)local_538);
                Imath_3_2::half::operator=
                          ((half *)CONCAT44(in_stack_fffffffffffff804,uVar12),
                           in_stack_fffffffffffff7fc);
              }
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  (anonymous_namespace)::channelTypes,(long)local_544);
              if (*pvVar8 == 2) {
                iVar3 = local_538 * local_78;
                pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
                ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_544,(long)local_538);
                *(float *)((long)ppvVar10[local_53c] + (ulong)local_548 * 4) =
                     (float)((iVar3 + local_53c) % 0x801);
              }
            }
          }
        }
      }
      Imf_3_2::DeepScanLineOutputFile::writePixels((int)local_288);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"bulk ");
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    for (local_524 = 0; local_524 < local_7c; local_524 = local_524 + 1) {
      for (local_528 = 0; local_528 < local_78; local_528 = local_528 + 1) {
        local_52c = random_int(in_stack_fffffffffffff804);
        if ((local_5c1) && ((local_524 % 0x3f != 0 || (local_528 % 0x3f != 0)))) {
          local_52c = 0;
        }
        puVar7 = Imf_3_2::Array2D<unsigned_int>::operator[]
                           ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                            (long)local_524);
        puVar7[local_528] = local_52c;
        for (local_530 = 0; local_530 < local_c; local_530 = local_530 + 1) {
          if ((int)local_52c < 1) {
            pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
            ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_530,(long)local_524);
            ppvVar10[local_528] = (void *)0x0;
          }
          else {
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_530);
            if (*pvVar8 == 0) {
              puVar7 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                 ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                  (long)local_524);
              pvVar11 = operator_new__((ulong)puVar7[local_528] << 2);
              pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
              ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_530,(long)local_524);
              ppvVar10[local_528] = pvVar11;
            }
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_530);
            if (*pvVar8 == 1) {
              puVar7 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                 ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                  (long)local_524);
              pvVar11 = operator_new__((ulong)puVar7[local_528] * 2);
              pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
              ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_530,(long)local_524);
              ppvVar10[local_528] = pvVar11;
            }
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (anonymous_namespace)::channelTypes,(long)local_530);
            if (*pvVar8 == 2) {
              puVar7 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                 ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                  (long)local_524);
              pvVar11 = operator_new__((ulong)puVar7[local_528] << 2);
              pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
              ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_530,(long)local_524);
              ppvVar10[local_528] = pvVar11;
            }
            for (local_534 = 0;
                puVar7 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                   ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,
                                    (long)local_524), local_534 < puVar7[local_528];
                local_534 = local_534 + 1) {
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  (anonymous_namespace)::channelTypes,(long)local_530);
              if (*pvVar8 == 0) {
                iVar3 = local_524 * local_78;
                pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
                ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_530,(long)local_524);
                *(int *)((long)ppvVar10[local_528] + (ulong)local_534 * 4) =
                     (iVar3 + local_528) % 0x801;
              }
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  (anonymous_namespace)::channelTypes,(long)local_530);
              if (*pvVar8 == 1) {
                pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
                Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_530,(long)local_524);
                Imath_3_2::half::operator=
                          ((half *)CONCAT44(in_stack_fffffffffffff804,uVar12),
                           in_stack_fffffffffffff7fc);
              }
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  (anonymous_namespace)::channelTypes,(long)local_530);
              if (*pvVar8 == 2) {
                iVar3 = local_524 * local_78;
                pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
                ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_530,(long)local_524);
                *(float *)((long)ppvVar10[local_528] + (ulong)local_534 * 4) =
                     (float)((iVar3 + local_528) % 0x801);
              }
            }
          }
        }
      }
    }
    Imf_3_2::DeepScanLineOutputFile::writePixels((int)local_288);
  }
  for (local_54c = 0; local_54c < local_7c; local_54c = local_54c + 1) {
    for (local_550 = 0; local_550 < local_78; local_550 = local_550 + 1) {
      for (local_554 = 0; local_554 < local_c; local_554 = local_554 + 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_554);
        if (*pvVar8 == 0) {
          pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
          ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_554,(long)local_54c);
          if (ppvVar10[local_550] != (void *)0x0) {
            operator_delete__(ppvVar10[local_550]);
          }
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_554);
        if (*pvVar8 == 1) {
          pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
          ppvVar10 = Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_554,(long)local_54c);
          if (ppvVar10[local_550] != (void *)0x0) {
            operator_delete__(ppvVar10[local_550]);
          }
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes
                            ,(long)local_554);
        if (*pvVar8 == 2) {
          pAVar9 = Imf_3_2::Array::operator_cast_to_Array2D_((Array *)(local_288 + 0x18));
          in_stack_fffffffffffff820 =
               (DeepFrameBuffer *)
               Imf_3_2::Array2D<void_*>::operator[](pAVar9 + local_554,(long)local_54c);
          pvVar11 = *(void **)((long)&(in_stack_fffffffffffff820->_map)._M_t._M_impl.field_0x0 +
                              (long)local_550 * 8);
          if (pvVar11 != (void *)0x0) {
            operator_delete__(pvVar11);
          }
        }
      }
    }
  }
  Imf_3_2::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x180ccd);
  Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile((DeepScanLineOutputFile *)local_288);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array
            ((Array<Imf_3_2::Array2D<void_*>_> *)in_stack_fffffffffffff820);
  return;
}

Assistant:

void
generateRandomFile (
    const std::string filename,
    int               channelCount,
    Compression       compression,
    bool              bulkWrite,
    const Box2i&      dataWindow,
    const Box2i&      displayWindow)
{
    cout << "generating " << flush;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    cout << "compression " << compression << " " << flush;

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int          type = random_int (3);
        stringstream ss;
        ss << i;
        string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPSCANLINE);

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    sampleCount.resizeErase (height, width);

    remove (filename.c_str ());
    DeepScanLineOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&sampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        stringstream ss;
        ss << i;
        string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str, // name // 6
            DeepSlice (
                type, // type // 7
                (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8
                pointerSize * 1,     // xStride// 9
                pointerSize * width, // yStride// 10
                sampleSize));        // sampleStride
    }

    file.setFrameBuffer (frameBuffer);

    int maxSamples = 10;

    bool bigFile = width > 1000 || height > 1000;

    cout << "writing " << flush;
    if (bulkWrite)
    {
        cout << "bulk " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                int samples = random_int (maxSamples);

                // big files write very sparse data for efficiency: most pixels have no samples

                if (bigFile && (i % 63 != 0 || j % 63 != 0)) { samples = 0; }
                sampleCount[i][j] = samples;

                for (int k = 0; k < channelCount; k++)
                {
                    if (samples > 0)
                    {

                        if (channelTypes[k] == 0)
                            data[k][i][j] = new unsigned int[sampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[sampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[sampleCount[i][j]];
                        for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                        {
                            if (channelTypes[k] == 0)
                                ((unsigned int*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 1)
                                ((half*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 2)
                                ((float*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                        }
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
            }
        }

        file.writePixels (height);
    }
    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                int samples = random_int (maxSamples);

                // big files write very sparse data for efficiency: most pixels have no samples
                if (bigFile && (i % 63 != 0 || j % 63 != 0)) { samples = 0; }
                sampleCount[i][j] = samples;

                for (int k = 0; k < channelCount; k++)
                {

                    if (samples > 0)
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] = new unsigned int[sampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[sampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[sampleCount[i][j]];
                        for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                        {
                            if (channelTypes[k] == 0)
                                ((unsigned int*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 1)
                                ((half*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 2)
                                ((float*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                        }
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
            }
            file.writePixels (1);
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0) delete[](unsigned int*) data[k][i][j];
                if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
            }
}